

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

void bullet_done_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object_Method local_20;
  Am_Object *local_10;
  Am_Object *cmd_local;
  
  local_10 = cmd;
  pAVar1 = (Am_Value *)Am_Object::Get(0xc220,0xca);
  Am_Object_Method::Am_Object_Method(&local_20,pAVar1);
  Am_Object::Am_Object(&local_28,cmd);
  (*local_20.Call)((Am_Object_Data *)&local_28);
  Am_Object::~Am_Object(&local_28);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x193);
  Am_Object::Am_Object(local_40,pAVar1);
  blot_bullet(local_40);
  Am_Object::~Am_Object(local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, bullet_done, (Am_Object cmd))
{
  Am_Object_Method(Am_Animator.Get(Am_DO_METHOD)).Call(cmd);
  blot_bullet(cmd.Get(Am_OPERATES_ON));
}